

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

iterator __thiscall
phmap::priv::
btree<phmap::priv::set_params<int,phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,std::allocator<int>,256,false>>
::internal_emplace<int_const&>
          (btree<phmap::priv::set_params<int,phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,std::allocator<int>,256,false>>
           *this,iterator iter,int *args)

{
  node_type nVar1;
  undefined4 uVar2;
  int iVar3;
  btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
  bVar4;
  node_type *pnVar5;
  btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
  **ppbVar6;
  btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
  **ppbVar7;
  btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
  **ppbVar8;
  btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
  *pbVar9;
  btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
  *pbVar10;
  ulong uVar11;
  btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
  *pbVar12;
  node_type nVar13;
  uint max_count;
  long lVar14;
  ulong uVar15;
  char *__function;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  allocator_type *in_R9;
  ulong uVar16;
  btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
  *this_00;
  bool bVar17;
  iterator iVar18;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
  local_50;
  btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
  *local_40;
  int *local_38;
  
  local_50.node = iter.node;
  local_50.position = iter.position;
  if (((undefined1  [16])iter & (undefined1  [16])0x7) == (undefined1  [16])0x0) {
    if (local_50.node[0xb] == (node_type)0x0) {
      btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
      ::operator--(&local_50);
      local_50.position = local_50.position + 1;
    }
    if (((ulong)local_50.node & 7) == 0) {
      nVar1 = local_50.node[0xb];
      uVar15 = (ulong)(byte)nVar1;
      nVar13 = (node_type)0x3d;
      if (nVar1 != (node_type)0x0) {
        nVar13 = nVar1;
      }
      if (local_50.node[10] == nVar13) {
        if ((byte)nVar13 < 0x3d) {
          if (local_50.node != *(node_type **)this) {
            __assert_fail("iter.node == root()",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                          ,0xc27,
                          "iterator phmap::priv::btree<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::KeyCompareToStrongOrdering, std::allocator<int>, 256, false>>::internal_emplace(iterator, Args &&...) [Params = phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::KeyCompareToStrongOrdering, std::allocator<int>, 256, false>, Args = <const int &>]"
                         );
          }
          max_count = 0x3d;
          if ((byte)((char)nVar13 * '\x02') < 0x3d) {
            max_count = (uint)(byte)((char)nVar13 * '\x02');
          }
          pnVar5 = btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                   ::new_leaf_root_node
                             ((btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                               *)this,max_count);
          local_50.node = pnVar5;
          if ((((ulong)pnVar5 & 7) != 0) ||
             (pbVar9 = *(btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                         **)this, ((ulong)pbVar9 & 7) != 0)) goto LAB_001d7ced;
          local_38 = args;
          if ((pnVar5[0xb] != (node_type)0x0) !=
              (pbVar9[0xb] !=
              (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
               )0x0)) {
            __assert_fail("leaf() == x->leaf()",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                          ,0x942,
                          "void phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::KeyCompareToStrongOrdering, std::allocator<int>, 256, false>>::swap(btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::KeyCompareToStrongOrdering, std::allocator<int>, 256, false>]"
                         );
          }
          this_00 = pnVar5;
          pbVar12 = pbVar9;
          if ((byte)pnVar5[10] <= (byte)pbVar9[10]) {
            this_00 = pbVar9;
            pbVar12 = pnVar5;
          }
          bVar4 = pbVar12[10];
          if (bVar4 != (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                        )0x0) {
            lVar14 = 0;
            do {
              uVar2 = *(undefined4 *)(pbVar12 + lVar14 + 0xc);
              *(undefined4 *)(pbVar12 + lVar14 + 0xc) = *(undefined4 *)(this_00 + lVar14 + 0xc);
              *(undefined4 *)(this_00 + lVar14 + 0xc) = uVar2;
              lVar14 = lVar14 + 4;
            } while ((ulong)(byte)bVar4 * 4 != lVar14);
          }
          uVar15 = (ulong)(byte)pbVar12[10];
          btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
          ::uninitialized_move_n(this_00,(byte)this_00[10] - uVar15,uVar15,uVar15,pbVar12,in_R9);
          if (pnVar5[0xb] == (node_type)0x0) {
            local_40 = pbVar9;
            ppbVar6 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                      ::mutable_child(pbVar12,0);
            ppbVar7 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                      ::mutable_child(pbVar12,(ulong)(byte)pbVar12[10] + 1);
            ppbVar8 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                      ::mutable_child(this_00,0);
            for (; ppbVar6 != ppbVar7; ppbVar6 = ppbVar6 + 1) {
              pbVar9 = *ppbVar6;
              *ppbVar6 = *ppbVar8;
              *ppbVar8 = pbVar9;
              ppbVar8 = ppbVar8 + 1;
            }
            uVar15 = 0;
            do {
              uVar11 = uVar15;
              pbVar9 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                       ::child(pbVar12,uVar11);
              if (((ulong)pbVar9 & 7) != 0) {
LAB_001d7cd6:
                __function = 
                "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::KeyCompareToStrongOrdering, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::KeyCompareToStrongOrdering, std::allocator<int>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::KeyCompareToStrongOrdering, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::KeyCompareToStrongOrdering, std::allocator<int>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 0UL, Char = char]"
                ;
                goto LAB_001d7d02;
              }
              *(btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                **)pbVar9 = pbVar12;
              pbVar10 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                        ::child(this_00,uVar11);
              pbVar9 = local_40;
              if (((ulong)pbVar10 & 7) != 0) goto LAB_001d7cd6;
              *(btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                **)pbVar10 = this_00;
              uVar15 = uVar11 + 1;
            } while (uVar11 < (byte)pbVar12[10]);
            if (uVar11 < (byte)this_00[10]) {
              do {
                pbVar10 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                          ::child(this_00,uVar15);
                btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                ::init_child(pbVar12,(int)uVar15,pbVar10);
                btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                ::mutable_child(this_00,uVar15);
                bVar17 = uVar15 < (byte)this_00[10];
                uVar15 = uVar15 + 1;
              } while (bVar17);
            }
          }
          bVar4 = pnVar5[10];
          pnVar5[10] = pbVar9[10];
          pbVar9[10] = bVar4;
          btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
          ::delete_leaf_node((btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                              *)this,*(node_type **)this);
          *(btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
            **)this = local_50.node;
          *(btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
            **)(this + 8) = local_50.node;
          uVar15 = extraout_RDX_00;
          args = local_38;
        }
        else {
          btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
          ::rebalance_or_split
                    ((btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                      *)this,&local_50);
          uVar15 = extraout_RDX;
        }
      }
      pbVar9 = local_50.node;
      if (((ulong)local_50.node & 7) == 0) {
        uVar16 = (ulong)local_50.position;
        uVar11 = (ulong)(byte)local_50.node[10];
        if (uVar11 < uVar16) {
          __assert_fail("i <= count()",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                        ,0x852,
                        "void phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::KeyCompareToStrongOrdering, std::allocator<int>, 256, false>>::emplace_value(const size_type, allocator_type *, Args &&...) [Params = phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::KeyCompareToStrongOrdering, std::allocator<int>, 256, false>, Args = <const int &>]"
                       );
        }
        for (; uVar16 < uVar11; uVar11 = uVar11 - 1) {
          *(undefined4 *)(local_50.node + uVar11 * 4 + 0xc) =
               *(undefined4 *)(local_50.node + uVar11 * 4 + 8);
        }
        iVar3 = *args;
        *(int *)(local_50.node + uVar16 * 4 + 0xc) = iVar3;
        bVar4 = (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                 )((char)local_50.node[10] + 1);
        pbVar12 = (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                   *)(ulong)CONCAT31((int3)((uint)iVar3 >> 8),bVar4);
        local_50.node[10] = bVar4;
        if (local_50.node[0xb] ==
            (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
             )0x0) {
          uVar16 = uVar16 + 1;
          uVar11 = (ulong)(byte)bVar4;
          if (uVar16 < (byte)bVar4) {
            while ((int)uVar16 < (int)uVar11) {
              uVar15 = (ulong)((int)uVar11 - 1);
              pbVar12 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                        ::child(pbVar9,uVar15);
              btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
              ::set_child(pbVar9,uVar11,pbVar12);
              uVar11 = uVar15;
            }
            pbVar12 = (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                       *)btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToStrongOrdering,_std::allocator<int>,_256,_false>_>
                         ::mutable_child(pbVar9,uVar16);
            uVar15 = extraout_RDX_01;
          }
        }
        *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
        iVar18._8_8_ = uVar15;
        iVar18.node = pbVar12;
        return iVar18;
      }
    }
  }
LAB_001d7ced:
  __function = 
  "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::KeyCompareToStrongOrdering, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::KeyCompareToStrongOrdering, std::allocator<int>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::KeyCompareToStrongOrdering, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::KeyCompareToStrongOrdering, std::allocator<int>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
  ;
LAB_001d7d02:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,__function);
}

Assistant:

inline auto btree<P>::internal_emplace(iterator iter, Args &&... args)
        -> iterator {
        if (!iter.node->leaf()) {
            // We can't insert on an internal node. Instead, we'll insert after the
            // previous value which is guaranteed to be on a leaf node.
            --iter;
            ++iter.position;
        }
        const int max_count = iter.node->max_count();
        if (iter.node->count() == max_count) {
            // Make room in the leaf for the new item.
            if (max_count < kNodeValues) {
                // Insertion into the root where the root is smaller than the full node
                // size. Simply grow the size of the root node.
                assert(iter.node == root());
                iter.node =
                    new_leaf_root_node((std::min<int>)(kNodeValues, 2 * max_count));
                iter.node->swap(root(), mutable_allocator());
                delete_leaf_node(root());
                mutable_root() = iter.node;
                rightmost_ = iter.node;
            } else {
                rebalance_or_split(&iter);
            }
        }
        iter.node->emplace_value(iter.position, mutable_allocator(),
                                 std::forward<Args>(args)...);
        ++size_;
        return iter;
    }